

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayReductionMethod::ArrayReductionMethod
          (ArrayReductionMethod *this,KnownSystemName knownNameId,Operator op)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  
  SystemSubroutine::SystemSubroutine
            ((SystemSubroutine *)op.callable,op.callback._4_4_,(SubroutineKind)op.callback);
  *in_RDI = &PTR__ArrayReductionMethod_00d7cae8;
  in_RDI[7] = in_RDX;
  in_RDI[8] = in_RCX;
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  return;
}

Assistant:

ArrayReductionMethod(KnownSystemName knownNameId, Operator op) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), op(op) {
        withClauseMode = WithClauseMode::Iterator;
    }